

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O0

void spdlog::set_default_logger(shared_ptr<spdlog::logger> *default_logger)

{
  shared_ptr<spdlog::logger> *in_RDI;
  registry *unaff_retaddr;
  shared_ptr<spdlog::logger> *in_stack_ffffffffffffffb8;
  shared_ptr<spdlog::logger> *new_default_logger;
  
  new_default_logger = in_RDI;
  details::registry::instance();
  std::shared_ptr<spdlog::logger>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  details::registry::set_default_logger(unaff_retaddr,new_default_logger);
  CLI::std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x6b35e7);
  return;
}

Assistant:

SPDLOG_INLINE void set_default_logger(std::shared_ptr<spdlog::logger> default_logger) {
    details::registry::instance().set_default_logger(std::move(default_logger));
}